

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget.cxx
# Opt level: O3

void __thiscall Fl_Widget::hide(Fl_Widget *this)

{
  Fl_Widget *o;
  Fl_Group *pFVar1;
  Fl_Group *this_00;
  
  pFVar1 = (Fl_Group *)this;
  do {
    if ((*(uint *)((long)&pFVar1->super_Fl_Widget + 0x60) & 2) != 0) {
      *(byte *)&this->flags_ = (byte)this->flags_ | 2;
      return;
    }
    pFVar1 = *(Fl_Group **)((long)&pFVar1->super_Fl_Widget + 8);
  } while (pFVar1 != (Fl_Group *)0x0);
  *(byte *)&this->flags_ = (byte)this->flags_ | 2;
  pFVar1 = this->parent_;
  do {
    this_00 = pFVar1;
    if (this_00 == (Fl_Group *)0x0) goto LAB_001dd096;
  } while ((*(uchar *)((long)&this_00->super_Fl_Widget + 0x6e) == '\0') &&
          (pFVar1 = *(Fl_Group **)((long)&this_00->super_Fl_Widget + 8),
          *(Fl_Group **)((long)&this_00->super_Fl_Widget + 8) != (Fl_Group *)0x0));
  redraw(&this_00->super_Fl_Widget);
LAB_001dd096:
  (*this->_vptr_Fl_Widget[3])(this,0xf);
  fl_throw_focus(this);
  return;
}

Assistant:

void Fl_Widget::hide() {
  if (visible_r()) {
    set_flag(INVISIBLE);
    for (Fl_Widget *p = parent(); p; p = p->parent())
      if (p->box() || !p->parent()) {p->redraw(); break;}
    handle(FL_HIDE);
    fl_throw_focus(this);
  } else {
    set_flag(INVISIBLE);
  }
}